

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void curve_motionfn(void *z,t_floatarg dx,t_floatarg dy,t_floatarg up)

{
  t_template *template;
  _glist *owner;
  t_scalar *sc;
  int iVar1;
  t_symbol *s;
  undefined1 local_40 [8];
  t_atom at;
  _fielddesc *f;
  t_curve *x;
  t_floatarg up_local;
  t_floatarg dy_local;
  t_floatarg dx_local;
  void *z_local;
  
  at.a_w.w_symbol =
       (t_symbol *)
       (*(long *)((long)z + 0xe0) + (long)*(int *)(pd_maininstance.pd_gui)->i_template * 0x28);
  if ((up == 0.0) && (!NAN(up))) {
    iVar1 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0x48),0);
    if (iVar1 == 0) {
      post("curve_motion: scalar disappeared");
    }
    else {
      *(float *)((pd_maininstance.pd_gui)->i_template + 4) =
           dx + *(float *)((pd_maininstance.pd_gui)->i_template + 4);
      *(float *)((pd_maininstance.pd_gui)->i_template + 0x10) =
           dy + *(float *)((pd_maininstance.pd_gui)->i_template + 0x10);
      if ((*(char *)((long)&(at.a_w.w_symbol)->s_name + 1) != '\0') && ((dx != 0.0 || (NAN(dx))))) {
        fielddesc_setcoord((_fielddesc *)at.a_w.w_symbol,
                           *(t_template **)((pd_maininstance.pd_gui)->i_template + 0x40),
                           *(t_word **)((pd_maininstance.pd_gui)->i_template + 0x38),
                           *(float *)((pd_maininstance.pd_gui)->i_template + 4) *
                           *(float *)((pd_maininstance.pd_gui)->i_template + 0xc) +
                           *(float *)((pd_maininstance.pd_gui)->i_template + 8),1);
      }
      if ((*(char *)((long)&((at.a_w.w_array)->a_gp).gp_valid + 1) != '\0') &&
         ((dy != 0.0 || (NAN(dy))))) {
        fielddesc_setcoord((_fielddesc *)&((at.a_w.w_array)->a_gp).gp_valid,
                           *(t_template **)((pd_maininstance.pd_gui)->i_template + 0x40),
                           *(t_word **)((pd_maininstance.pd_gui)->i_template + 0x38),
                           *(float *)((pd_maininstance.pd_gui)->i_template + 0x10) *
                           *(float *)((pd_maininstance.pd_gui)->i_template + 0x18) +
                           *(float *)((pd_maininstance.pd_gui)->i_template + 0x14),1);
      }
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0x28) != 0) {
        template = *(t_template **)((pd_maininstance.pd_gui)->i_template + 0x40);
        owner = *(_glist **)((pd_maininstance.pd_gui)->i_template + 0x20);
        sc = *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0x28);
        s = gensym("change");
        template_notifyforscalar(template,owner,sc,s,1,(t_atom *)local_40);
      }
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0x28) != 0) {
        scalar_redraw(*(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0x28),
                      *(_glist **)((pd_maininstance.pd_gui)->i_template + 0x20));
      }
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0x30) != 0) {
        array_redraw(*(_array **)((pd_maininstance.pd_gui)->i_template + 0x30),
                     *(_glist **)((pd_maininstance.pd_gui)->i_template + 0x20));
      }
    }
  }
  return;
}

Assistant:

static void curve_motionfn(void *z, t_floatarg dx, t_floatarg dy, t_floatarg up)
{
    t_curve *x = (t_curve *)z;
    t_fielddesc *f = x->x_vec + TEMPLATE->curve_motion_field;
    t_atom at;
    if (up != 0)
        return;
    if (!gpointer_check(&TEMPLATE->curve_motion_gpointer, 0))
    {
        post("curve_motion: scalar disappeared");
        return;
    }
    TEMPLATE->curve_motion_xcumulative += dx;
    TEMPLATE->curve_motion_ycumulative += dy;
    if (f->fd_var && (dx != 0))
    {
        fielddesc_setcoord(f, TEMPLATE->curve_motion_template,
            TEMPLATE->curve_motion_wp,
            TEMPLATE->curve_motion_xbase +
            TEMPLATE->curve_motion_xcumulative * TEMPLATE->curve_motion_xper,
                1);
    }
    if ((f+1)->fd_var && (dy != 0))
    {
        fielddesc_setcoord(f+1, TEMPLATE->curve_motion_template,
            TEMPLATE->curve_motion_wp,
            TEMPLATE->curve_motion_ybase +
            TEMPLATE->curve_motion_ycumulative * TEMPLATE->curve_motion_yper,
                1);
    }
        /* LATER figure out what to do to notify for an array? */
    if (TEMPLATE->curve_motion_scalar)
        template_notifyforscalar(TEMPLATE->curve_motion_template,
            TEMPLATE->curve_motion_glist,
            TEMPLATE->curve_motion_scalar, gensym("change"), 1, &at);
    if (TEMPLATE->curve_motion_scalar)
        scalar_redraw(TEMPLATE->curve_motion_scalar,
            TEMPLATE->curve_motion_glist);
    if (TEMPLATE->curve_motion_array)
        array_redraw(TEMPLATE->curve_motion_array,
            TEMPLATE->curve_motion_glist);
}